

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O3

void __thiscall crnlib::qdxt1::~qdxt1(qdxt1 *this)

{
  ulong uVar1;
  long lVar2;
  void *pvVar3;
  vector<unsigned_int> *p;
  long lVar4;
  long lVar5;
  
  spinlock::~spinlock(&this->m_cluster_hash_lock);
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  ::~hash_map(&this->m_cluster_hash);
  lVar5 = 0x18e0;
  do {
    pvVar3 = *(void **)((long)(this->m_params).m_mip_desc + lVar5 + -0x5c);
    lVar4 = lVar5 + -0x10;
    if (pvVar3 != (void *)0x0) {
      uVar1 = (ulong)*(uint *)((long)((this->m_params).m_mip_desc + -7) + lVar5);
      if (uVar1 != 0) {
        lVar2 = 0;
        do {
          if (*(void **)((long)pvVar3 + lVar2) != (void *)0x0) {
            crnlib_free(*(void **)((long)pvVar3 + lVar2));
          }
          lVar2 = lVar2 + 0x10;
        } while (uVar1 << 4 != lVar2);
        pvVar3 = *(void **)((long)(this->m_params).m_mip_desc + lVar5 + -0x5c);
      }
      crnlib_free(pvVar3);
    }
    lVar5 = lVar4;
  } while (lVar4 != 0x8e0);
  lVar5 = 0;
  do {
    clusterizer<crnlib::vec<16U,_float>_>::~clusterizer
              ((clusterizer<crnlib::vec<16U,_float>_> *)
               ((long)&(this->m_selector_clusterizer).m_clusterizers[3].m_training_vecs.m_p + lVar5)
              );
    lVar5 = lVar5 + -0x70;
  } while (lVar5 != -0x1c0);
  p = (this->m_endpoint_cluster_indices).m_p;
  if (p != (vector<unsigned_int> *)0x0) {
    uVar1 = (ulong)(this->m_endpoint_cluster_indices).m_size;
    if (uVar1 != 0) {
      lVar5 = 0;
      do {
        pvVar3 = *(void **)((long)&p->m_p + lVar5);
        if (pvVar3 != (void *)0x0) {
          crnlib_free(pvVar3);
        }
        lVar5 = lVar5 + 0x10;
      } while (uVar1 << 4 != lVar5);
      p = (this->m_endpoint_cluster_indices).m_p;
    }
    crnlib_free(p);
  }
  clusterizer<crnlib::vec<6U,_float>_>::~clusterizer(&this->m_endpoint_clusterizer);
  return;
}

Assistant:

qdxt1::~qdxt1()
    {
    }